

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O0

void correctResiduals(HighsLpSolverObject *solver_object)

{
  reference pvVar1;
  double *pdVar2;
  undefined8 *in_RDI;
  double dVar3;
  double abs_dual_residual;
  double dual_residual;
  HighsInt iCol_1;
  double check_primal_residual;
  double abs_primal_residual;
  double primal_residual;
  HighsInt iRow;
  double use_dual_residual_tolerance;
  double sum_dual_correction;
  double max_dual_correction;
  HighsInt num_dual_correction;
  double norm_dual_residual;
  double use_primal_residual_tolerance;
  double sum_primal_correction;
  double max_primal_correction;
  HighsInt num_primal_correction;
  double norm_primal_residual;
  HighsInt iCol;
  vector<double,_std::allocator<double>_> check_col_dual;
  vector<double,_std::allocator<double>_> check_row_value;
  HighsLp *lp;
  bool *have_dual_solution;
  bool *have_primal_solution;
  HighsSolution *solution;
  HighsOptions *options;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffec0;
  double local_f8;
  double local_f0;
  int local_e4;
  double local_e0;
  double local_d8;
  double local_d0;
  int local_c4;
  double local_c0;
  double local_b8;
  pointer local_b0;
  uint local_a4;
  double local_a0;
  double local_98;
  double local_90;
  double in_stack_ffffffffffffff78;
  HighsInt debug_report;
  char *format;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar4;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff88;
  HighsLogOptions *log_options_;
  undefined4 in_stack_ffffffffffffff90;
  int iVar5;
  undefined4 in_stack_ffffffffffffff94;
  vector<double,_std::allocator<double>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  int *local_30;
  byte *local_28;
  long local_20;
  long local_18;
  long local_10;
  
  debug_report = (HighsInt)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  local_10 = in_RDI[6];
  local_20 = in_RDI[2];
  local_28 = (byte *)(local_20 + 1);
  local_30 = (int *)*in_RDI;
  local_18 = local_20;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x5293df);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x5293ec);
  HighsSparseMatrix::productQuad
            ((HighsSparseMatrix *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88,
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),debug_report);
  if ((*local_28 & 1) != 0) {
    HighsSparseMatrix::productTransposeQuad
              ((HighsSparseMatrix *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,
               (vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),debug_report);
    for (iVar5 = 0; iVar5 < *local_30; iVar5 = iVar5 + 1) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_30 + 2),(long)iVar5);
      dVar3 = *pvVar1;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_60,(long)iVar5);
      *pvVar1 = *pvVar1 - dVar3;
    }
  }
  log_options_ = (HighsLogOptions *)0x0;
  uVar4 = 0;
  format = (char *)0x0;
  local_90 = 0.0;
  local_98 = *(double *)(local_10 + 0x130);
  local_a0 = 0.0;
  local_a4 = 0;
  local_b0 = (pointer)0x0;
  local_b8 = 0.0;
  local_c0 = *(double *)(local_10 + 0x138);
  for (local_c4 = 0; local_c4 < local_30[1]; local_c4 = local_c4 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,(long)local_c4);
    dVar3 = *pvVar1;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_18 + 0x38),(long)local_c4)
    ;
    dVar3 = dVar3 - *pvVar1;
    local_d8 = ABS(dVar3);
    local_d0 = dVar3;
    if (local_98 < local_d8) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x38),
                          (long)local_c4);
      *pvVar1 = *pvVar1 + dVar3;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_48,(long)local_c4);
      dVar3 = *pvVar1;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x38),
                          (long)local_c4);
      local_e0 = ABS(dVar3 - *pvVar1);
      uVar4 = uVar4 + 1;
      pdVar2 = std::max<double>(&local_d8,(double *)&stack0xffffffffffffff78);
      format = (char *)*pdVar2;
      local_90 = local_d8 + local_90;
    }
    pdVar2 = std::max<double>(&local_d8,(double *)&stack0xffffffffffffff88);
    log_options_ = (HighsLogOptions *)*pdVar2;
  }
  if ((*local_28 & 1) != 0) {
    for (local_e4 = 0; local_e4 < *local_30; local_e4 = local_e4 + 1) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](&local_60,(long)local_e4);
      dVar3 = *pvVar1;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),
                          (long)local_e4);
      dVar3 = dVar3 + *pvVar1;
      local_f8 = ABS(dVar3);
      local_f0 = dVar3;
      if (local_c0 < local_f8) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),
                            (long)local_e4);
        *pvVar1 = *pvVar1 - dVar3;
        local_a4 = local_a4 + 1;
        in_stack_fffffffffffffec0 =
             (vector<double,_std::allocator<double>_> *)
             std::max<double>(&local_f8,(double *)&local_b0);
        local_b0 = (in_stack_fffffffffffffec0->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        local_b8 = local_f8 + local_b8;
      }
      pdVar2 = std::max<double>(&local_f8,&local_a0);
      local_a0 = *pdVar2;
    }
  }
  if ((0 < (int)uVar4) || (0 < (int)local_a4)) {
    highsLogUser(log_options_,SUB84(local_a0,0),format,local_90,local_b0,local_b8,local_10 + 0x380,4
                 ,
                 "LP solver residuals: primal = %g; dual = %g yield num/max/sum primal (%d/%g/%g) and dual (%d/%g/%g) corrections\n"
                 ,(ulong)uVar4,(ulong)local_a4);
  }
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffec0);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffec0);
  return;
}

Assistant:

void correctResiduals(HighsLpSolverObject& solver_object) {
  HighsOptions& options = solver_object.options_;
  HighsSolution& solution = solver_object.solution_;
  const bool& have_primal_solution = solution.value_valid;
  const bool& have_dual_solution = solution.dual_valid;
  assert(have_primal_solution);
  assert(have_dual_solution);
  HighsLp& lp = solver_object.lp_;
  std::vector<double> check_row_value;
  std::vector<double> check_col_dual;
  lp.a_matrix_.productQuad(check_row_value, solution.col_value);
  if (have_dual_solution) {
    lp.a_matrix_.productTransposeQuad(check_col_dual, solution.row_dual);
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      check_col_dual[iCol] -= lp.col_cost_[iCol];
  }
  double norm_primal_residual = 0;
  HighsInt num_primal_correction = 0;
  double max_primal_correction = 0;
  double sum_primal_correction = 0;
  double use_primal_residual_tolerance = options.primal_residual_tolerance;

  double norm_dual_residual = 0;
  HighsInt num_dual_correction = 0;
  double max_dual_correction = 0;
  double sum_dual_correction = 0;
  double use_dual_residual_tolerance = options.dual_residual_tolerance;

  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    double primal_residual = check_row_value[iRow] - solution.row_value[iRow];
    double abs_primal_residual = std::fabs(primal_residual);
    if (abs_primal_residual > use_primal_residual_tolerance) {
      solution.row_value[iRow] += primal_residual;
      double check_primal_residual =
          std::fabs(check_row_value[iRow] - solution.row_value[iRow]);
      assert(check_primal_residual < 1e-10);
      num_primal_correction++;
      max_primal_correction =
          std::max(abs_primal_residual, max_primal_correction);
      sum_primal_correction += abs_primal_residual;
    }
    norm_primal_residual = std::max(abs_primal_residual, norm_primal_residual);
  }
  if (have_dual_solution) {
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      double dual_residual = check_col_dual[iCol] + solution.col_dual[iCol];
      double abs_dual_residual = std::fabs(dual_residual);
      if (abs_dual_residual > use_dual_residual_tolerance) {
        solution.col_dual[iCol] -= dual_residual;
        num_dual_correction++;
        max_dual_correction = std::max(abs_dual_residual, max_dual_correction);
        sum_dual_correction += abs_dual_residual;
      }
      norm_dual_residual = std::max(abs_dual_residual, norm_dual_residual);
    }
  }

  if (num_primal_correction > 0 || num_dual_correction > 0)
    highsLogUser(
        options.log_options, HighsLogType::kWarning,
        "LP solver residuals: primal = %g; dual = %g yield num/max/sum primal "
        "(%d/%g/%g) and dual (%d/%g/%g) corrections\n",
        norm_primal_residual, norm_dual_residual, int(num_primal_correction),
        max_primal_correction, sum_primal_correction, int(num_dual_correction),
        max_dual_correction, sum_dual_correction);
}